

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Player.cpp
# Opt level: O0

void __thiscall Player::displayHand(Player *this,int row)

{
  bool bVar1;
  ostream *poVar2;
  reference ppCVar3;
  void *this_00;
  Card *c;
  iterator __end1;
  iterator __begin1;
  vector<Card_*,_std::allocator<Card_*>_> *__range1;
  Cursor local_20;
  int local_14;
  Player *pPStack_10;
  int row_local;
  Player *this_local;
  
  local_14 = row;
  pPStack_10 = this;
  AdvancedConsole::Cursor::Cursor(&local_20,row,0,AC_ABSOLUTE);
  poVar2 = AdvancedConsole::operator<<((ostream *)&std::cout,&local_20);
  AdvancedConsole::Erase::Erase((Erase *)&__range1,AC_ALL,AC_LINE);
  poVar2 = AdvancedConsole::operator<<(poVar2,(Erase *)&__range1);
  std::operator<<(poVar2,"Your Hand: ");
  __end1 = std::vector<Card_*,_std::allocator<Card_*>_>::begin(&this->_hand);
  c = (Card *)std::vector<Card_*,_std::allocator<Card_*>_>::end(&this->_hand);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<Card_**,_std::vector<Card_*,_std::allocator<Card_*>_>_>
                                *)&c);
    if (!bVar1) break;
    ppCVar3 = __gnu_cxx::__normal_iterator<Card_**,_std::vector<Card_*,_std::allocator<Card_*>_>_>::
              operator*(&__end1);
    poVar2 = ::operator<<((ostream *)&std::cout,*ppCVar3);
    std::operator<<(poVar2,"  ");
    __gnu_cxx::__normal_iterator<Card_**,_std::vector<Card_*,_std::allocator<Card_*>_>_>::operator++
              (&__end1);
  }
  this_00 = (void *)std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void Player::displayHand(int row) {
    cout << AdvancedConsole::Cursor(row, 0) << AdvancedConsole::Erase(AdvancedConsole::AC_ALL, AdvancedConsole::AC_LINE)
         << "Your Hand: ";
    for (Card *c: _hand) {
        cout << *c << "  ";
    }
    cout << endl << endl;

}